

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glSetVertexShaderUniformF(uint idx,float *data,uint vec4n)

{
  uint uVar1;
  uint cpy;
  uint maxregs;
  uint vec4n_local;
  float *data_local;
  uint idx_local;
  
  if (idx < 0x2000) {
    uVar1 = minuint(0x2000 - idx,vec4n);
    memcpy(ctx->vs_reg_file_f + (idx << 2),data,(ulong)(uVar1 << 4));
    ctx->generation = ctx->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetVertexShaderUniformF(unsigned int idx, const float *data,
                                          unsigned int vec4n)
{
    const uint maxregs = STATICARRAYLEN(ctx->vs_reg_file_f) / 4;
    if (idx < maxregs)
    {
        assert(sizeof (GLfloat) == sizeof (float));
        const uint cpy = (minuint(maxregs - idx, vec4n) * sizeof (*data)) * 4;
        memcpy(ctx->vs_reg_file_f + (idx * 4), data, cpy);
        ctx->generation++;
    } // if
}